

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_markable.cpp
# Opt level: O2

void most_hostile_types::
     test_interface_for<most_hostile_types::mark_hostile_for<most_hostile_types::with_order_none::Val,most_hostile_types::with_order_none::Ref,most_hostile_types::with_order_none::Rep,most_hostile_types::with_order_none::Store>,ak_toolkit::markable_ns::order_by_value>
               (void)

{
  storage_type local_10;
  
  local_10.val.v = 2;
  local_10.rep.v = 0;
  ak_toolkit::markable_ns::
  markable<most_hostile_types::mark_hostile_for<most_hostile_types::with_order_none::Val,_most_hostile_types::with_order_none::Ref,_most_hostile_types::with_order_none::Rep,_most_hostile_types::with_order_none::Store>,_ak_toolkit::markable_ns::order_by_value>
  ::value((markable<most_hostile_types::mark_hostile_for<most_hostile_types::with_order_none::Val,_most_hostile_types::with_order_none::Ref,_most_hostile_types::with_order_none::Rep,_most_hostile_types::with_order_none::Store>,_ak_toolkit::markable_ns::order_by_value>
           *)&local_10);
  return;
}

Assistant:

void test_interface_for()
  {
    using Rep = typename markable<MP, OP>::representation_type;
    using Val = typename markable<MP, OP>::value_type;

    markable<MP, OP> mh1, mh2{Val{1}};
    const Rep rep{2};
    const Val val{2};
    mh1 = mh2;
    mh1.assign(Val{2});
    mh1.assign(val);
    (void)mh1.has_value();
    (void)mh1.value();
    (void)mh1.representation_value();

    mh2.assign_representation(Rep{2});
    mh2.assign_representation(rep);

    swap(mh1, mh2);
  }